

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UChar * ures_getStringWithAlias
                  (UResourceBundle *resB,Resource r,int32_t sIndex,int32_t *len,UErrorCode *status)

{
  UResourceBundle *resB_00;
  UChar *pUVar1;
  
  if ((r & 0xf0000000) == 0x30000000) {
    resB_00 = ures_getByIndex_63(resB,sIndex,(UResourceBundle *)0x0,status);
    pUVar1 = ures_getString_63(resB_00,len,status);
    ures_closeBundle(resB_00,'\x01');
    return pUVar1;
  }
  pUVar1 = res_getString_63(&resB->fResData,r,len);
  return pUVar1;
}

Assistant:

static const UChar* ures_getStringWithAlias(const UResourceBundle *resB, Resource r, int32_t sIndex, int32_t *len, UErrorCode *status) {
  if(RES_GET_TYPE(r) == URES_ALIAS) {
    const UChar* result = 0;
    UResourceBundle *tempRes = ures_getByIndex(resB, sIndex, NULL, status);
    result = ures_getString(tempRes, len, status);
    ures_close(tempRes);
    return result;
  } else {
    return res_getString(&(resB->fResData), r, len); 
  }
}